

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cpp
# Opt level: O0

float anon_unknown.dwarf_1b915::eval_pawns<(Color)1>(position *p,einfo *ei)

{
  int iVar1;
  int *piVar2;
  ulong local_48;
  U64 baseAttks;
  U64 undefended;
  ulong local_30;
  U64 kattks;
  U64 pawnAttacks;
  einfo *peStack_18;
  float score;
  einfo *ei_local;
  position *p_local;
  
  pawnAttacks._4_4_ = 0.0;
  kattks = ei->pe->attacks[1];
  local_30 = kattks & ei->kmask[0];
  peStack_18 = ei;
  ei_local = (einfo *)p;
  if (local_30 != 0) {
    ei->kattackers[1][0] = ei->kattackers[1][0] + 1;
    ei->kattk_points[1][0] = local_30 | ei->kattk_points[1][0];
    undefended._4_4_ = 2;
    undefended._0_4_ = bits::count(&local_30);
    piVar2 = std::min<int>((int *)((long)&undefended + 4),(int *)&undefended);
    pawnAttacks._4_4_ = (p->params).pawn_king[*piVar2] + pawnAttacks._4_4_;
  }
  baseAttks = peStack_18->pe->undefended[0];
  local_48 = kattks & baseAttks;
  if (local_48 != 0) {
    iVar1 = bits::count(&local_48);
    pawnAttacks._4_4_ = (float)iVar1 * 0.5 + pawnAttacks._4_4_;
  }
  return pawnAttacks._4_4_;
}

Assistant:

float eval_pawns(const position& p, einfo& ei) {


		//std::cout << " \n======eval_pawns for c" << c << "========" << std::endl;
		float score = 0;
		// pawn harassment of enemy king
		auto pawnAttacks = ei.pe->attacks[c];
		U64 kattks = pawnAttacks & ei.kmask[c^1];
		if (kattks) {
			ei.kattackers[c][pawn]++; // kattackers of "other" king
			ei.kattk_points[c][pawn] |= kattks; // attack points of "other" king
			score += p.params.pawn_king[std::min(2, bits::count(kattks))];
		}

		// pawn chain bases/undefended pawns
		auto undefended = ei.pe->undefended[c ^ 1];
		auto baseAttks = pawnAttacks & undefended;
		if (baseAttks)
			score += 0.5 * bits::count(baseAttks);


		//std::cout << "Score.PawnEval=" << score << std::endl;

		return score;
	}